

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall
HEkkPrimal::hyperChooseColumnChangedInfeasibility
          (HEkkPrimal *this,double infeasibility,HighsInt iCol)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = infeasibility * infeasibility;
  dVar1 = this->max_changed_measure_value;
  pdVar3 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = pdVar3[iCol];
  dVar5 = this->max_hyper_chuzc_non_candidate_measure;
  if (dVar1 * dVar2 < dVar4) {
    if (dVar5 <= dVar1) {
      dVar5 = dVar1;
    }
    this->max_hyper_chuzc_non_candidate_measure = dVar5;
    this->max_changed_measure_value = dVar4 / pdVar3[iCol];
    this->max_changed_measure_column = iCol;
    return;
  }
  if (dVar5 * dVar2 < dVar4) {
    this->max_hyper_chuzc_non_candidate_measure = dVar4 / dVar2;
  }
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumnChangedInfeasibility(
    const double infeasibility, const HighsInt iCol) {
  if (infeasibility * infeasibility >
      max_changed_measure_value * edge_weight_[iCol]) {
    max_hyper_chuzc_non_candidate_measure =
        max(max_changed_measure_value, max_hyper_chuzc_non_candidate_measure);
    max_changed_measure_value =
        infeasibility * infeasibility / edge_weight_[iCol];
    max_changed_measure_column = iCol;
  } else if (infeasibility * infeasibility >
             max_hyper_chuzc_non_candidate_measure * edge_weight_[iCol]) {
    max_hyper_chuzc_non_candidate_measure =
        infeasibility * infeasibility / edge_weight_[iCol];
  }
}